

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::
newAdaptedPromise<void,kj::TimerImpl::TimerPromiseAdapter,kj::TimerImpl::Impl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>
          (kj *this,Impl *adapterConstructorParams,
          Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
          *adapterConstructorParams_1)

{
  Impl *params;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *params_1;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *local_20;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
  *adapterConstructorParams_local_1;
  Impl *adapterConstructorParams_local;
  
  local_20 = adapterConstructorParams_1;
  adapterConstructorParams_local_1 =
       (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
       adapterConstructorParams;
  adapterConstructorParams_local = (Impl *)this;
  params = fwd<kj::TimerImpl::Impl&>(adapterConstructorParams);
  params_1 = fwd<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>(local_20)
  ;
  heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>,kj::TimerImpl::Impl&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>
            ((kj *)&local_40,params,params_1);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AdapterPromiseNode<kj::_::Void,kj::TimerImpl::TimerPromiseAdapter>,void>
            (&local_30,&local_40);
  Promise<void>::Promise((Promise<void> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_>::~Own(&local_40);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> newAdaptedPromise(Params&&... adapterConstructorParams) {
  return Promise<T>(false, heap<_::AdapterPromiseNode<_::FixVoid<T>, Adapter>>(
      kj::fwd<Params>(adapterConstructorParams)...));
}